

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O3

bool __thiscall duckdb_re2::DFA::AnalyzeSearch(DFA *this,SearchParams *params)

{
  byte bVar1;
  const_pointer pcVar2;
  const_pointer pcVar3;
  State *pSVar4;
  bool bVar5;
  uint uVar6;
  byte *pbVar7;
  uint32_t flags;
  StartInfo *info;
  bool bVar8;
  ostringstream local_198 [112];
  ios_base local_128 [264];
  
  pcVar2 = (params->text).data_;
  pcVar3 = (params->context).data_;
  if (pcVar2 < pcVar3) {
LAB_00489c5b:
    std::__cxx11::ostringstream::ostringstream(local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"context does not contain text",0x1d);
    std::__cxx11::ostringstream::~ostringstream(local_198);
    std::ios_base::~ios_base(local_128);
    params->start = (State *)0x1;
    return true;
  }
  pbVar7 = (byte *)(pcVar2 + (params->text).size_);
  if (pcVar3 + (params->context).size_ < pbVar7) goto LAB_00489c5b;
  if (params->run_forward == true) {
    if (pcVar2 != pcVar3) {
      bVar1 = pcVar2[-1];
LAB_00489ccf:
      if (bVar1 == 10) {
        flags = 1;
        uVar6 = 2;
      }
      else {
        bVar5 = (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a;
        bVar8 = (byte)(bVar1 - 0x30) < 10;
        uVar6 = (uint)((bVar1 != 0x5f && !bVar8) && !bVar5) * 2 + 4;
        flags = (uint)((bVar1 == 0x5f || bVar8) || bVar5) << 9;
      }
      goto LAB_00489d1b;
    }
  }
  else if (pbVar7 != (byte *)(pcVar3 + (params->context).size_)) {
    bVar1 = *pbVar7;
    goto LAB_00489ccf;
  }
  flags = 5;
  uVar6 = 0;
LAB_00489d1b:
  info = this->start_ + (uVar6 | params->anchored);
  bVar5 = AnalyzeSearchHelper(this,params,info,flags);
  if (!bVar5) {
    ResetCache(this,params->cache_lock);
    bVar5 = AnalyzeSearchHelper(this,params,info,flags);
    if (!bVar5) {
      params->failed = true;
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"Failed to analyze start state.",0x1e);
      std::__cxx11::ostringstream::~ostringstream(local_198);
      std::ios_base::~ios_base(local_128);
      return false;
    }
  }
  pSVar4 = (info->start)._M_b._M_p;
  params->start = pSVar4;
  if (this->prog_->prefix_size_ == 0) {
    return true;
  }
  if (params->anchored != false) {
    return true;
  }
  if (pSVar4 < (State *)&DAT_00000003) {
    return true;
  }
  if (0xffff < pSVar4->flag_) {
    return true;
  }
  params->can_prefix_accel = true;
  return true;
}

Assistant:

bool DFA::AnalyzeSearch(SearchParams* params) {
  const StringPiece& text = params->text;
  const StringPiece& context = params->context;

  // Sanity check: make sure that text lies within context.
  if (BeginPtr(text) < BeginPtr(context) || EndPtr(text) > EndPtr(context)) {
    LOG(DFATAL) << "context does not contain text";
    params->start = DeadState;
    return true;
  }

  // Determine correct search type.
  int start;
  uint32_t flags;
  if (params->run_forward) {
    if (BeginPtr(text) == BeginPtr(context)) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (BeginPtr(text)[-1] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(BeginPtr(text)[-1] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  } else {
    if (EndPtr(text) == EndPtr(context)) {
      start = kStartBeginText;
      flags = kEmptyBeginText|kEmptyBeginLine;
    } else if (EndPtr(text)[0] == '\n') {
      start = kStartBeginLine;
      flags = kEmptyBeginLine;
    } else if (Prog::IsWordChar(EndPtr(text)[0] & 0xFF)) {
      start = kStartAfterWordChar;
      flags = kFlagLastWord;
    } else {
      start = kStartAfterNonWordChar;
      flags = 0;
    }
  }
  if (params->anchored)
    start |= kStartAnchored;
  StartInfo* info = &start_[start];

  // Try once without cache_lock for writing.
  // Try again after resetting the cache
  // (ResetCache will relock cache_lock for writing).
  if (!AnalyzeSearchHelper(params, info, flags)) {
    ResetCache(params->cache_lock);
    if (!AnalyzeSearchHelper(params, info, flags)) {
      params->failed = true;
      LOG(DFATAL) << "Failed to analyze start state.";
      return false;
    }
  }

  params->start = info->start.load(std::memory_order_acquire);

  // Even if we could prefix accel, we cannot do so when anchored and,
  // less obviously, we cannot do so when we are going to need flags.
  // This trick works only when there is a single byte that leads to a
  // different state!
  if (prog_->can_prefix_accel() &&
      !params->anchored &&
      params->start > SpecialStateMax &&
      params->start->flag_ >> kFlagNeedShift == 0)
    params->can_prefix_accel = true;

  return true;
}